

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O3

bool __thiscall Minisat::Solver::check_invariants(Solver *this)

{
  int iVar1;
  uint uVar2;
  VarData *pVVar3;
  uint *puVar4;
  Watcher *pWVar5;
  bool bVar6;
  uint uVar7;
  ostream *poVar8;
  long *plVar9;
  Lit old_trail_top;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  vec<unsigned_int> *pvVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  long lVar25;
  bool bVar26;
  vec<Minisat::Watcher> *pvVar27;
  ulong *puVar28;
  long lVar29;
  bool bVar30;
  
  iVar10 = (this->trail).sz;
  bVar6 = true;
  if (0 < iVar10) {
    uVar17 = 0;
    bVar6 = true;
    do {
      pVVar3 = (this->vardata).data;
      iVar12 = (this->trail).data[uVar17].x >> 1;
      iVar1 = pVVar3[iVar12].level;
      if ((((long)iVar1 != 0) && (pVVar3[iVar12].reason == 0xffffffff)) &&
         (uVar17 != (uint)(this->trail_lim).data[(long)iVar1 + -1])) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"c trail literal ",0x10);
        uVar7 = (this->trail).data[uVar17].x;
        uVar20 = (int)uVar7 >> 1;
        uVar11 = ~uVar20;
        if ((uVar7 & 1) == 0) {
          uVar11 = uVar20 + 1;
        }
        std::ostream::operator<<((ostream *)&std::cout,uVar11);
        std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," at level ",10);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," (pos: ",7);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)uVar17);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar8," has no proper reason clause",0x1c);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
        iVar10 = (this->trail).sz;
        bVar6 = false;
      }
      uVar17 = uVar17 + 1;
    } while ((long)uVar17 < (long)iVar10);
  }
  iVar10 = 0;
  do {
    pvVar14 = &this->clauses;
    if ((iVar10 != 0) && (pvVar14 = &this->learnts_core, iVar10 != 1)) {
      pvVar14 = &this->learnts_tier2 + (iVar10 != 2);
    }
    if (0 < pvVar14->sz) {
      lVar25 = 0;
      do {
        uVar7 = pvVar14->data[lVar25];
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        uVar17 = *(ulong *)(puVar4 + uVar7);
        if (((uint)uVar17 & 3) != 1) {
          puVar28 = (ulong *)(puVar4 + uVar7);
          if ((uVar17 & 0xfffffffc00000000) == 0x400000000) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"c there should not be unit clauses! [",0x25);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
            if (0x3ffffffff < *puVar28) {
              uVar17 = 0;
              do {
                uVar7 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                uVar20 = (int)uVar7 >> 1;
                uVar11 = ~uVar20;
                if ((uVar7 & 1) == 0) {
                  uVar11 = uVar20 + 1;
                }
                std::ostream::operator<<((ostream *)poVar8,uVar11);
                std::ostream::flush();
                std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                uVar17 = uVar17 + 1;
              } while (uVar17 < *puVar28 >> 0x22);
            }
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            bVar6 = false;
          }
          else {
            lVar29 = 0;
            bVar30 = true;
            if (uVar17 < 0xc00000000) {
              do {
                bVar26 = bVar30;
                iVar1 = *(int *)((long)puVar28 + lVar29 * 4 + 8);
                uVar15 = (long)iVar1 ^ 1;
                pvVar27 = (this->watches_bin).occs.data;
                uVar17 = (ulong)pvVar27[uVar15].sz;
                if ((long)uVar17 < 1) {
                  iVar12 = 0;
LAB_00117d4a:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c could not find clause[",0x18);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar11 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar13 = (int)uVar11 >> 1;
                      uVar20 = ~uVar13;
                      if ((uVar11 & 1) == 0) {
                        uVar20 = uVar13 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar20);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in watcher for lit [",0x15);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)lVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  uVar11 = ~(iVar1 >> 1);
                  if (((long)iVar1 & 1U) != 0) {
                    uVar11 = (iVar1 >> 1) + 1;
                  }
                  std::ostream::operator<<((ostream *)poVar8,uVar11);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," 1 time, but ",0xd);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," times",6);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                else {
                  pWVar5 = pvVar27[uVar15].data;
                  if (pWVar5->cref == uVar7) {
                    iVar12 = 1;
                    bVar30 = true;
                  }
                  else {
                    uVar15 = 1;
                    do {
                      uVar24 = uVar15;
                      if (uVar17 == uVar24) {
                        iVar12 = 0;
                        goto LAB_00117d3c;
                      }
                      uVar15 = uVar24 + 1;
                    } while (pWVar5[uVar24].cref != uVar7);
                    iVar12 = 1;
LAB_00117d3c:
                    bVar30 = uVar24 < uVar17;
                  }
                  if (!bVar30) goto LAB_00117d4a;
                }
                lVar29 = 1;
                bVar30 = false;
              } while (bVar26);
            }
            else {
              do {
                bVar26 = bVar30;
                iVar1 = *(int *)((long)puVar28 + lVar29 * 4 + 8);
                uVar15 = (long)iVar1 ^ 1;
                pvVar27 = (this->watches).occs.data;
                uVar17 = (ulong)pvVar27[uVar15].sz;
                if ((long)uVar17 < 1) {
                  iVar12 = 0;
LAB_00117b56:
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c could not find clause[",0x18);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar11 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar13 = (int)uVar11 >> 1;
                      uVar20 = ~uVar13;
                      if ((uVar11 & 1) == 0) {
                        uVar20 = uVar13 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar20);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in watcher for lit [",0x15);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,(int)lVar29);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  uVar11 = ~(iVar1 >> 1);
                  if (((long)iVar1 & 1U) != 0) {
                    uVar11 = (iVar1 >> 1) + 1;
                  }
                  std::ostream::operator<<((ostream *)poVar8,uVar11);
                  std::ostream::flush();
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," 1 time, but ",0xd);
                  poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar12);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8," times",6);
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                else {
                  pWVar5 = pvVar27[uVar15].data;
                  if (pWVar5->cref == uVar7) {
                    iVar12 = 1;
                    bVar30 = true;
                  }
                  else {
                    uVar15 = 1;
                    do {
                      uVar24 = uVar15;
                      if (uVar17 == uVar24) {
                        iVar12 = 0;
                        goto LAB_00117b48;
                      }
                      uVar15 = uVar24 + 1;
                    } while (pWVar5[uVar24].cref != uVar7);
                    iVar12 = 1;
LAB_00117b48:
                    bVar30 = uVar24 < uVar17;
                  }
                  if (!bVar30) goto LAB_00117b56;
                }
                lVar29 = 1;
                bVar30 = false;
              } while (bVar26);
            }
          }
        }
        lVar25 = lVar25 + 1;
      } while (lVar25 < pvVar14->sz);
    }
    iVar10 = iVar10 + 1;
    if (iVar10 == 4) {
      if (0 < (this->vardata).sz) {
        lVar25 = 0;
        do {
          uVar7 = (uint)lVar25;
          lVar29 = lVar25 + 1;
          uVar11 = 0;
          bVar30 = true;
          do {
            bVar26 = bVar30;
            uVar13 = uVar11 | uVar7 * 2;
            pvVar27 = (this->watches).occs.data;
            uVar20 = pvVar27[uVar13].sz;
            uVar17 = (ulong)uVar20;
            if (0 < (int)uVar20) {
              pvVar27 = pvVar27 + uVar13;
              uVar20 = (uint)lVar29;
              if (uVar11 != 0) {
                uVar20 = ~uVar7;
              }
              lVar18 = 1;
              lVar16 = 0;
              do {
                uVar2 = pvVar27->data[lVar16].cref;
                puVar28 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar2);
                lVar16 = lVar16 + 1;
                lVar19 = lVar18;
                if (lVar16 < (int)uVar17) {
                  do {
                    if (pvVar27->data[lVar19].cref == uVar2) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"c found clause [",0x10);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                      if (0x3ffffffff < *puVar28) {
                        uVar17 = 0;
                        do {
                          uVar23 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                          uVar21 = (int)uVar23 >> 1;
                          uVar22 = ~uVar21;
                          if ((uVar23 & 1) == 0) {
                            uVar22 = uVar21 + 1;
                          }
                          std::ostream::operator<<((ostream *)poVar8,uVar22);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          uVar17 = uVar17 + 1;
                        } while (uVar17 < *puVar28 >> 0x22);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," multiple times in watch lists of literal ",0x2a);
                      std::ostream::operator<<((ostream *)poVar8,uVar20);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      uVar17 = (ulong)(uint)pvVar27->sz;
                    }
                    lVar19 = lVar19 + 1;
                  } while ((int)lVar19 < (int)uVar17);
                }
                uVar17 = *puVar28;
                if (((uint)uVar17 & 3) == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found deleted clause [",0x18);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar2 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar22 = (int)uVar2 >> 1;
                      uVar23 = ~uVar22;
                      if ((uVar2 & 1) == 0) {
                        uVar23 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar23);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in watch lists of literal ",0x1b);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  uVar17 = *puVar28;
                }
                if (uVar17 < 0xc00000000) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found binary or smaller clause [",0x22);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar2 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar22 = (int)uVar2 >> 1;
                      uVar23 = ~uVar22;
                      if ((uVar2 & 1) == 0) {
                        uVar23 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar23);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in watch list of literal ",0x1a);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                if (((uint)puVar28[1] != (uVar13 ^ 1)) &&
                   (*(uint *)((long)puVar28 + 0xc) != (uVar13 ^ 1))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c wrong literals for clause [",0x1d);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar2 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar22 = (int)uVar2 >> 1;
                      uVar23 = ~uVar22;
                      if ((uVar2 & 1) == 0) {
                        uVar23 = uVar22 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar23);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," are watched. Found in list for ",0x20);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                uVar17 = (ulong)pvVar27->sz;
                lVar18 = lVar18 + 1;
              } while (lVar16 < (long)uVar17);
            }
            pvVar27 = (this->watches_bin).occs.data;
            uVar20 = pvVar27[uVar13].sz;
            uVar17 = (ulong)uVar20;
            if (0 < (int)uVar20) {
              pvVar27 = pvVar27 + uVar13;
              uVar20 = (uint)lVar29;
              if (uVar11 != 0) {
                uVar20 = ~uVar7;
              }
              lVar18 = 1;
              lVar16 = 0;
              do {
                uVar11 = pvVar27->data[lVar16].cref;
                puVar28 = (ulong *)((this->ca).super_RegionAllocator<unsigned_int>.memory + uVar11);
                lVar16 = lVar16 + 1;
                lVar19 = lVar18;
                if (lVar16 < (int)uVar17) {
                  do {
                    if (pvVar27->data[lVar19].cref == uVar11) {
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&std::cout,"c found clause [",0x10);
                      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                      if (0x3ffffffff < *puVar28) {
                        uVar17 = 0;
                        do {
                          uVar2 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                          uVar22 = (int)uVar2 >> 1;
                          uVar23 = ~uVar22;
                          if ((uVar2 & 1) == 0) {
                            uVar23 = uVar22 + 1;
                          }
                          std::ostream::operator<<((ostream *)poVar8,uVar23);
                          std::ostream::flush();
                          std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                          uVar17 = uVar17 + 1;
                        } while (uVar17 < *puVar28 >> 0x22);
                      }
                      std::__ostream_insert<char,std::char_traits<char>>
                                (poVar8," multiple times in watch lists of literal ",0x2a);
                      std::ostream::operator<<((ostream *)poVar8,uVar20);
                      std::ostream::flush();
                      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8)
                      ;
                      std::ostream::put((char)poVar8);
                      std::ostream::flush();
                      uVar17 = (ulong)(uint)pvVar27->sz;
                    }
                    lVar19 = lVar19 + 1;
                  } while ((int)lVar19 < (int)uVar17);
                }
                uVar17 = *puVar28;
                if (((uint)uVar17 & 3) == 1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found deleted clause [",0x18);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar11 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar23 = (int)uVar11 >> 1;
                      uVar2 = ~uVar23;
                      if ((uVar11 & 1) == 0) {
                        uVar2 = uVar23 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar2);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in watch lists of literal ",0x1b);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  uVar17 = *puVar28;
                }
                if ((uVar17 & 0xfffffffc00000000) != 0x800000000) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c found non-binary clause [",0x1b);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"]",1);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar11 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar23 = (int)uVar11 >> 1;
                      uVar2 = ~uVar23;
                      if ((uVar11 & 1) == 0) {
                        uVar2 = uVar23 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar2);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," in binary watch list of literal ",0x21);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                if (((uint)puVar28[1] != (uVar13 ^ 1)) &&
                   (*(uint *)((long)puVar28 + 0xc) != (uVar13 ^ 1))) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,"c wrong literals for clause [",0x1d);
                  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar8,"] ",2);
                  if (0x3ffffffff < *puVar28) {
                    uVar17 = 0;
                    do {
                      uVar11 = *(uint *)((long)puVar28 + uVar17 * 4 + 8);
                      uVar23 = (int)uVar11 >> 1;
                      uVar2 = ~uVar23;
                      if ((uVar11 & 1) == 0) {
                        uVar2 = uVar23 + 1;
                      }
                      std::ostream::operator<<((ostream *)poVar8,uVar2);
                      std::ostream::flush();
                      std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
                      uVar17 = uVar17 + 1;
                    } while (uVar17 < *puVar28 >> 0x22);
                  }
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar8," are watched. Found in list for ",0x20);
                  std::ostream::operator<<((ostream *)poVar8,uVar20);
                  std::ostream::flush();
                  std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
                  std::ostream::put((char)poVar8);
                  std::ostream::flush();
                  bVar6 = false;
                }
                uVar17 = (ulong)pvVar27->sz;
                lVar18 = lVar18 + 1;
              } while (lVar16 < (long)uVar17);
            }
            uVar11 = 1;
            bVar30 = false;
          } while (bVar26);
          if ((this->seen).data[lVar25] != '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"c seen for variable ",0x14);
            poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar8," is not 0, but ",0xf);
            plVar9 = (long *)std::ostream::operator<<
                                       ((ostream *)poVar8,(int)(this->seen).data[lVar25]);
            std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
            std::ostream::put((char)plVar9);
            std::ostream::flush();
            bVar6 = false;
          }
          lVar25 = lVar29;
        } while (lVar29 < (this->vardata).sz);
      }
      iVar10 = (this->old_trail).sz;
      if (0 < iVar10) {
        uVar7 = (this->old_trail).data[this->old_trail_qhead].x;
        uVar11 = (this->oldreasons).data[(int)uVar7 >> 1];
        puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
        do {
          if ((uVar11 != 0xffffffff) &&
             ((*(ulong *)(puVar4 + uVar11) & 0xfffffffc00000000) != 0x800000000)) {
            bVar6 = (bool)(bVar6 & puVar4[(ulong)uVar11 + 2] == uVar7);
          }
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      return bVar6;
    }
  } while( true );
}

Assistant:

bool Solver::check_invariants()
{
    TRACE(printf("c check solver invariants\n");)

    bool pass = true;
    bool fatal_on_watch_removed = false;

    /* ensure that each assigned literal has a proper reason clause as well */
    for (int i = 0; i < trail.size(); ++i) {
        Var v = var(trail[i]);
        int l = level(v);
        if (!(l == 0 || reason(v) != CRef_Undef || trail_lim[l - 1] == i)) {
            std::cout << "c trail literal " << trail[i] << " at level " << l << " (pos: " << i
                      << " has no proper reason clause" << std::endl;
            pass = false;
        }
    }

    // check whether clause is in solver in the right watch lists
    for (int p = 0; p < 4; ++p) {

        const vec<CRef> &clause_list = (p == 0 ? clauses : (p == 1 ? learnts_core : (p == 2 ? learnts_tier2 : learnts_local)));
        for (int i = 0; i < clause_list.size(); ++i) {
            const CRef cr = clause_list[i];
            const Clause &c = ca[cr];
            if (c.mark() == 1) {
                continue;
            }

            if (c.size() == 1) {
                std::cout << "c there should not be unit clauses! [" << cr << "]" << c << std::endl;
                pass = false;
            } else {
                if (c.size() > 2) {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                } else {
                    for (int j = 0; j < 2; ++j) {
                        const Lit l = ~c[j];
                        vec<Watcher> &ws = watches_bin[l];
                        int didFind = 0;
                        for (int j = 0; j < ws.size(); ++j) {
                            CRef wcr = ws[j].cref;
                            if (wcr == cr) {
                                didFind++;
                                break;
                            }
                        }
                        if (didFind != 1) {
                            std::cout << "c could not find clause[" << cr << "] " << c << " in watcher for lit [" << j
                                      << "]" << l << " 1 time, but " << didFind << " times" << std::endl;
                            pass = false;
                        }
                    }
                }
            }
        }
    }

    for (Var v = 0; v < nVars(); ++v) {
        for (int p = 0; p < 2; ++p) {
            const Lit l = mkLit(v, p == 1);
            vec<Watcher> &ws = watches[l];
            for (int j = 0; j < ws.size(); ++j) {
                CRef wcr = ws[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws.size(); ++k) {
                    CRef inner_cr = ws[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() <= 2) {
                    std::cout << "c found binary or smaller clause [" << wcr << "]" << c << " in watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
            vec<Watcher> &ws_bin = watches_bin[l];
            for (int j = 0; j < ws_bin.size(); ++j) {
                CRef wcr = ws_bin[j].cref;
                const Clause &c = ca[wcr];

                for (int k = j + 1; k < ws_bin.size(); ++k) {
                    CRef inner_cr = ws_bin[k].cref;
                    if (inner_cr == wcr) {
                        std::cout << "c found clause [" << wcr << "] " << c
                                  << " multiple times in watch lists of literal " << l << std::endl;
                        if (fatal_on_watch_removed) pass = false;
                    }
                }

                if (c.mark() == 1) {
                    std::cout << "c found deleted clause [" << wcr << "]" << c << " in watch lists of literal " << l << std::endl;
                    if (fatal_on_watch_removed) pass = false;
                }
                if (c.size() != 2) {
                    std::cout << "c found non-binary clause [" << wcr << "]" << c << " in binary watch list of literal "
                              << l << std::endl;
                    pass = false;
                }
                if (c[0] != ~l && c[1] != ~l) {
                    std::cout << "c wrong literals for clause [" << wcr << "] " << c
                              << " are watched. Found in list for " << l << std::endl;
                    pass = false;
                }
            }
        }
        if (seen[v] != 0) {
            std::cout << "c seen for variable " << v << " is not 0, but " << (int)seen[v] << std::endl;
            pass = false;
        }
    }

    for (int i = 0; i < old_trail.size(); ++i) {
        const Lit old_trail_top = old_trail[old_trail_qhead];
        const CRef old_reason = oldreasons[var(old_trail_top)];
        if (old_reason == CRef_Undef) continue;
        const Clause &c = ca[old_reason];
        assert((c.size() == 2 || c[0] == old_trail_top) && "assert literal has to be at first position");
        if (!(c.size() == 2 || c[0] == old_trail_top)) pass = false;
    }


    assert(pass && "some solver invariant check failed");
    return pass;
}